

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint64_t farmhashna::Hash64(char *s,size_t len)

{
  uint64_t uVar1;
  long lVar2;
  uint64_t mul_00;
  uint64_t uVar3;
  char *a;
  char *s_00;
  ulong in_RSI;
  char *in_RDI;
  uint64_t mul;
  char *last64;
  char *end;
  pair<unsigned_long,_unsigned_long> w;
  pair<unsigned_long,_unsigned_long> v;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  uint64_t seed;
  int *in_stack_fffffffffffffeb8;
  int shift;
  uint64_t in_stack_fffffffffffffec0;
  uint64_t in_stack_fffffffffffffed0;
  uint64_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  unsigned_long uVar4;
  pair<unsigned_long,_unsigned_long> local_d0;
  size_t local_c0;
  char *in_stack_ffffffffffffff50;
  pair<unsigned_long,_unsigned_long> local_a8;
  pair<unsigned_long,_unsigned_long> local_98;
  char *local_88;
  char *local_80;
  undefined4 local_78;
  undefined4 local_74;
  pair<int,_int> local_70;
  pair<unsigned_long,_unsigned_long> local_68;
  undefined4 local_58;
  undefined4 local_54;
  pair<int,_int> local_50;
  pair<unsigned_long,_unsigned_long> local_48;
  ulong local_38;
  uint64_t local_30;
  unsigned_long local_28 [2];
  ulong local_18;
  char *local_10;
  uint64_t local_8;
  
  local_28[1] = 0x51;
  if (in_RSI < 0x21) {
    if (in_RSI < 0x11) {
      local_8 = HashLen0to16(in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
    }
    else {
      local_8 = HashLen17to32(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
  }
  else if (in_RSI < 0x41) {
    local_8 = HashLen33to64(in_stack_ffffffffffffff50,local_c0);
  }
  else {
    local_28[0] = 0x51;
    local_30 = 0x226bb95b4e64b6d4;
    local_18 = in_RSI;
    local_10 = in_RDI;
    uVar1 = ShiftMix(0x919387da22096bdd);
    local_38 = uVar1 * -0x651e95c4d06fbfb1;
    local_54 = 0;
    local_58 = 0;
    local_50 = std::make_pair<int,int>(in_stack_fffffffffffffeb8,(int *)0x206617);
    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_48,&local_50);
    local_74 = 0;
    local_78 = 0;
    local_70 = std::make_pair<int,int>(in_stack_fffffffffffffeb8,(int *)0x20665f);
    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_68,&local_70);
    lVar2 = local_28[0] * -0x651e95c4d06fbfb1;
    uVar1 = util::Fetch64(local_10);
    local_28[0] = lVar2 + uVar1;
    local_80 = local_10 + (local_18 - 1 & 0xffffffffffffffc0);
    local_88 = local_80 + ((local_18 - 1 & 0x3f) - 0x3f);
    if (local_10 + (local_18 - 0x40) != local_88) {
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash.cc"
                    ,0x226,"uint64_t farmhashna::Hash64(const char *, size_t)");
    }
    do {
      util::Fetch64(local_10 + 8);
      uVar1 = util::Rotate64(in_stack_fffffffffffffec0,
                             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      local_28[0] = uVar1 * -0x4b6d499041670d8d;
      util::Fetch64(local_10 + 0x30);
      local_30 = util::Rotate64(in_stack_fffffffffffffec0,
                                (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      local_30 = local_30 * -0x4b6d499041670d8d;
      local_28[0] = local_68.second ^ local_28[0];
      uVar4 = local_48.first;
      uVar1 = util::Fetch64(local_10 + 0x28);
      local_30 = uVar4 + uVar1 + local_30;
      uVar1 = util::Rotate64(in_stack_fffffffffffffec0,
                             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      local_38 = uVar1 * -0x4b6d499041670d8d;
      local_98 = WeakHashLen32WithSeeds
                           (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                            in_stack_fffffffffffffed0);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_48,&local_98);
      util::Fetch64(local_10 + 0x10);
      local_a8 = WeakHashLen32WithSeeds
                           (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                            in_stack_fffffffffffffed0);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_68,&local_a8);
      std::swap<unsigned_long>(&local_38,local_28);
      local_10 = local_10 + 0x40;
    } while (local_10 != local_80);
    mul_00 = (local_38 & 0xff) * 2 + 0xb492b66fbe98f273;
    local_10 = local_88;
    lVar2 = (local_18 - 1 & 0x3f) + local_68.first;
    local_48.first = lVar2 + local_48.first;
    local_68.first = local_48.first + lVar2;
    shift = (int)(local_28[0] + local_30 + local_48.first >> 0x20);
    util::Fetch64(local_88 + 8);
    uVar1 = util::Rotate64(in_stack_fffffffffffffec0,shift);
    local_28[0] = uVar1 * mul_00;
    uVar1 = local_30 + local_48.second;
    util::Fetch64(local_10 + 0x30);
    local_30 = util::Rotate64(uVar1,shift);
    local_30 = local_30 * mul_00;
    local_28[0] = local_68.second * 9 ^ local_28[0];
    lVar2 = local_48.first * 9;
    uVar3 = util::Fetch64(local_10 + 0x28);
    local_30 = lVar2 + uVar3 + local_30;
    uVar1 = util::Rotate64(uVar1,shift);
    local_38 = uVar1 * mul_00;
    _local_c0 = WeakHashLen32WithSeeds
                          (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                           in_stack_fffffffffffffed0);
    std::pair<unsigned_long,_unsigned_long>::operator=(&local_48,(type)&local_c0);
    a = local_10 + 0x20;
    s_00 = (char *)(local_38 + local_68.second);
    uVar1 = local_30;
    util::Fetch64(local_10 + 0x10);
    local_d0 = WeakHashLen32WithSeeds(s_00,(uint64_t)a,uVar1);
    std::pair<unsigned_long,_unsigned_long>::operator=(&local_68,&local_d0);
    std::swap<unsigned_long>(&local_38,local_28);
    uVar1 = HashLen16(local_48.first,local_68.first,mul_00);
    uVar3 = ShiftMix(local_30);
    uVar1 = uVar1 + uVar3 * -0x3c5a37a36834ced9 + local_38;
    uVar3 = HashLen16(local_48.second,local_68.second,mul_00);
    local_8 = HashLen16(uVar1,uVar3 + local_28[0],mul_00);
  }
  return local_8;
}

Assistant:

uint64_t Hash64(const char *s, size_t len) {
  const uint64_t seed = 81;
  if (len <= 32) {
    if (len <= 16) {
      return HashLen0to16(s, len);
    } else {
      return HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 56 bytes: v, w, x, y, and z.
  uint64_t x = seed;
  uint64_t y = seed * k1 + 113;
  uint64_t z = ShiftMix(y * k2 + 113) * k2;
  pair<uint64_t, uint64_t> v = make_pair(0, 0);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  x = x * k2 + Fetch(s);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
  } while (s != end);
  uint64_t mul = k1 + ((z & 0xff) << 1);
  // Make s point to the last 64 bytes of input.
  s = last64;
  w.first += ((len - 1) & 63);
  v.first += w.first;
  w.first += v.first;
  x = Rotate(x + y + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y + v.second + Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first * 9 + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  std::swap(z, x);
  return HashLen16(HashLen16(v.first, w.first, mul) + ShiftMix(y) * k0 + z,
                   HashLen16(v.second, w.second, mul) + x,
                   mul);
}